

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twosided_exponential_dist.hpp
# Opt level: O3

result_type_conflict3 * __thiscall
trng::twosided_exponential_dist<long_double>::cdf
          (result_type_conflict3 *__return_storage_ptr__,
          twosided_exponential_dist<long_double> *this,result_type_conflict3 x)

{
  result_type_conflict3 *prVar1;
  
  if (x._0_10_ <= (longdouble)0) {
    prVar1 = (result_type_conflict3 *)expl();
  }
  else {
    prVar1 = (result_type_conflict3 *)expl();
  }
  return prVar1;
}

Assistant:

cdf(result_type x) const {
      return x <= 0 ? math::exp(x / P.mu()) / 2 : 1 - math::exp(-x / P.mu()) / 2;
    }